

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_rfc5444.c
# Opt level: O0

void oonf_rfc5444_send_target_data(oonf_rfc5444_target *target,void *ptr,size_t len)

{
  os_interface_listener *interf;
  netaddr_socket sock;
  size_t len_local;
  void *ptr_local;
  oonf_rfc5444_target *target_local;
  undefined *local_20;
  long local_18;
  oonf_rfc5444_interface *local_10;
  
  local_10 = target->interface;
  sock.storage.__ss_align = len;
  len_local = (size_t)ptr;
  ptr_local = target;
  netaddr_socket_init(&interf,&target->dst,target->interface->protocol->port,
                      ((local_10->_socket)._if_listener.data)->index);
  _print_packet_to_buffer
            (LOG_RFC5444_W,(netaddr_socket *)&interf,
             *(oonf_rfc5444_interface **)((long)ptr_local + 0x98),(uint8_t *)len_local,
             sock.storage.__ss_align,"Outgoing RFC5444 packet to",
             "Error while parsing outgoing RFC5444 packet to");
  if ((_block_output & 1U) == 0) {
    if ((ptr_local == *(void **)(*(long *)((long)ptr_local + 0x98) + 0x830)) ||
       (ptr_local == *(void **)(*(long *)((long)ptr_local + 0x98) + 0x838))) {
      local_18 = (long)ptr_local + 0x80;
      oonf_packet_send_managed_multicast
                ((oonf_packet_managed *)(*(long *)((long)ptr_local + 0x98) + 0x88),(void *)len_local
                 ,sock.storage.__ss_align,(uint)*(byte *)((long)ptr_local + 0x90));
    }
    else {
      oonf_packet_send_managed
                ((oonf_packet_managed *)(*(long *)((long)ptr_local + 0x98) + 0x88),
                 (netaddr_socket *)&interf,(void *)len_local,sock.storage.__ss_align);
    }
  }
  else {
    local_20 = &log_global_mask;
    target_local._4_4_ = _oonf_rfc5444_subsystem.logging;
    target_local._0_4_ = 1;
    if (((&log_global_mask)[_oonf_rfc5444_subsystem.logging] & 1) != 0) {
      oonf_log(1,_oonf_rfc5444_subsystem.logging,"src/base/oonf_rfc5444.c",0x378,0,0,
               "Output blocked");
    }
  }
  return;
}

Assistant:

void
oonf_rfc5444_send_target_data(struct oonf_rfc5444_target *target, const void *ptr, size_t len) {
  union netaddr_socket sock;
  struct os_interface_listener *interf;

  interf = oonf_rfc5444_get_core_if_listener(target->interface);
  netaddr_socket_init(&sock, &target->dst, target->interface->protocol->port, interf->data->index);

  _print_packet_to_buffer(LOG_RFC5444_W, &sock, target->interface, ptr, len, "Outgoing RFC5444 packet to",
    "Error while parsing outgoing RFC5444 packet to");

  if (_block_output) {
    OONF_DEBUG(LOG_RFC5444, "Output blocked");
    return;
  }
  if (target == target->interface->multicast4 || target == target->interface->multicast6) {
    oonf_packet_send_managed_multicast(&target->interface->_socket, ptr, len, netaddr_get_address_family(&target->dst));
  }
  else {
    oonf_packet_send_managed(&target->interface->_socket, &sock, ptr, len);
  }
}